

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::Renderbuffers::GetParameterErrorsTest::PrepareObjects
          (GetParameterErrorsTest *this)

{
  code *pcVar1;
  char cVar2;
  int iVar3;
  deUint32 dVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  long lVar7;
  bool bVar8;
  long lVar6;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar6 + 0x6e8))(1,&this->m_rbo_valid);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x2585);
  (**(code **)(lVar6 + 0xa0))(0x8d41,this->m_rbo_valid);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x2588);
  GVar5 = this->m_parameter_invalid;
  do {
    GVar5 = GVar5 + 1;
    lVar7 = 0;
    bVar8 = false;
    do {
      if (*(GLenum *)((long)PrepareObjects()::valid_parameters + lVar7) == GVar5) {
        bVar8 = true;
      }
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x28);
  } while (bVar8);
  this->m_parameter_invalid = GVar5;
  do {
    pcVar1 = *(code **)(lVar6 + 0xca8);
    this->m_rbo_invalid = this->m_rbo_invalid + 1;
    cVar2 = (*pcVar1)();
  } while (cVar2 != '\0');
  return;
}

Assistant:

void GetParameterErrorsTest::PrepareObjects()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Valid objects. */
	gl.genRenderbuffers(1, &m_rbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	/* Invalid parameter. */
	bool is_parameter = true;

	while (is_parameter)
	{
		is_parameter = false;

		++m_parameter_invalid;

		static const glw::GLenum valid_parameters[] = { GL_RENDERBUFFER_WIDTH,			 GL_RENDERBUFFER_HEIGHT,
														GL_RENDERBUFFER_INTERNAL_FORMAT, GL_RENDERBUFFER_SAMPLES,
														GL_RENDERBUFFER_RED_SIZE,		 GL_RENDERBUFFER_GREEN_SIZE,
														GL_RENDERBUFFER_BLUE_SIZE,		 GL_RENDERBUFFER_ALPHA_SIZE,
														GL_RENDERBUFFER_DEPTH_SIZE,		 GL_RENDERBUFFER_STENCIL_SIZE };

		static const glw::GLuint valid_parameters_count = sizeof(valid_parameters) / sizeof(valid_parameters[0]);

		for (glw::GLuint i = 0; i < valid_parameters_count; ++i)
		{
			if (valid_parameters[i] == m_parameter_invalid)
			{
				is_parameter = true;
			}
		}
	}

	/* Invalid objects. */
	while (gl.isRenderbuffer(++m_rbo_invalid))
		;
}